

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfRelocator.cpp
# Opt level: O0

bool __thiscall
MipsElfRelocator::processHi16Entries
          (MipsElfRelocator *this,uint32_t lo16Opcode,int64_t lo16RelocationBase,
          vector<RelocationAction,_std::allocator<RelocationAction>_> *actions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  bool bVar1;
  uint local_94;
  ulong uStack_90;
  uint32_t opcode;
  int64_t fullPosition;
  int32_t addend;
  string local_78;
  reference local_58;
  Hi16Entry *hi16;
  iterator __end1;
  iterator __begin1;
  vector<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_> *__range1;
  bool result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errors_local;
  vector<RelocationAction,_std::allocator<RelocationAction>_> *actions_local;
  int64_t lo16RelocationBase_local;
  uint32_t lo16Opcode_local;
  MipsElfRelocator *this_local;
  
  __range1._7_1_ = true;
  __end1 = std::vector<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>::
           begin(&this->hi16Entries);
  hi16 = (Hi16Entry *)
         std::vector<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>::end
                   (&this->hi16Entries);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<MipsElfRelocator::Hi16Entry_*,_std::vector<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>_>
                                *)&hi16);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<MipsElfRelocator::Hi16Entry_*,_std::vector<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>_>
               ::operator*(&__end1);
    if (local_58->relocationBase == lo16RelocationBase) {
      fullPosition._0_4_ = local_58->opcode * 0x10000 + (int)(short)lo16Opcode;
      uStack_90 = (long)(int)fullPosition + local_58->relocationBase;
      local_94 = local_58->opcode & 0xffff0000 |
                 (int)(uStack_90 >> 0x10) + (uint)((uStack_90 & 0x8000) != 0) & 0xffff;
      std::vector<RelocationAction,std::allocator<RelocationAction>>::
      emplace_back<long_const&,unsigned_int&>
                ((vector<RelocationAction,std::allocator<RelocationAction>> *)actions,
                 &local_58->offset,&local_94);
    }
    else {
      tinyformat::format<>
                (&local_78,"Mismatched R_MIPS_HI16 with R_MIPS_LO16 of a different symbol");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(errors,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      __range1._7_1_ = false;
    }
    __gnu_cxx::
    __normal_iterator<MipsElfRelocator::Hi16Entry_*,_std::vector<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>_>
    ::operator++(&__end1);
  }
  std::vector<MipsElfRelocator::Hi16Entry,_std::allocator<MipsElfRelocator::Hi16Entry>_>::clear
            (&this->hi16Entries);
  return __range1._7_1_;
}

Assistant:

bool MipsElfRelocator::processHi16Entries(uint32_t lo16Opcode, int64_t lo16RelocationBase, std::vector<RelocationAction>& actions, std::vector<std::string>& errors)
{
	bool result = true;

	for (const Hi16Entry &hi16: hi16Entries)
	{
		if (hi16.relocationBase != lo16RelocationBase)
		{
			errors.push_back(tfm::format("Mismatched R_MIPS_HI16 with R_MIPS_LO16 of a different symbol"));
			result = false;
			continue;
		}

		int32_t addend = (int32_t)((hi16.opcode & 0xFFFF) << 16) + (int16_t)(lo16Opcode & 0xFFFF);
		int64_t fullPosition = addend + hi16.relocationBase;
		uint32_t opcode = (hi16.opcode & 0xffff0000) | (((fullPosition >> 16) + ((fullPosition & 0x8000) != 0)) & 0xFFFF);
		actions.emplace_back(hi16.offset, opcode);
	}

	hi16Entries.clear();
	return result;
}